

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O0

bool __thiscall stackjit::AssemblyImage::loadClassBody(AssemblyImage *this,string *className)

{
  size_type sVar1;
  mapped_type *pmVar2;
  string *this_00;
  AttributeContainer *pAVar3;
  __node_base_ptr p_Var4;
  vector<stackjit::Loader::Field,std::allocator<stackjit::Loader::Field>> *this_01;
  size_t *in_RCX;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [8];
  Field field;
  string fieldType;
  _anonymous_namespace_ local_100 [8];
  string fieldName;
  undefined1 local_e0 [8];
  AttributeContainer attributes;
  size_t i;
  unsigned_long numFields;
  _anonymous_namespace_ local_50 [32];
  Class *local_30;
  Class *classDef;
  mapped_type bodyOffset;
  string *className_local;
  AssemblyImage *this_local;
  
  bodyOffset = (mapped_type)className;
  className_local = (string *)this;
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::count(&this->mClassBodyOffsets,className);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->mClassBodyOffsets,className);
    classDef = (Class *)*pmVar2;
    local_30 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Class>_>_>
               ::operator[](&this->mClasses,className);
    (anonymous_namespace)::loadString_abi_cxx11_(local_50,&this->mImageData,(size_t *)&classDef);
    this_00 = Loader::Class::parentClassName_abi_cxx11_(local_30);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    AssemblyImageLoader::loadAttributes_abi_cxx11_
              ((AttributeContainer *)&numFields,(AssemblyImageLoader *)this,(BinaryData *)&classDef,
               in_RCX);
    pAVar3 = Loader::Class::attributes_abi_cxx11_(local_30);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
    ::operator=(pAVar3,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
                        *)&numFields);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
                      *)&numFields);
    p_Var4 = (__node_base_ptr)
             anon_unknown_5::loadData<unsigned_long>(&this->mImageData,(size_t *)&classDef);
    for (attributes._M_h._M_single_bucket = (__node_base_ptr)0x0;
        attributes._M_h._M_single_bucket < p_Var4;
        attributes._M_h._M_single_bucket =
             (__node_base_ptr)((long)&(attributes._M_h._M_single_bucket)->_M_nxt + 1)) {
      AssemblyImageLoader::loadAttributes_abi_cxx11_
                ((AttributeContainer *)local_e0,(AssemblyImageLoader *)this,(BinaryData *)&classDef,
                 in_RCX);
      (anonymous_namespace)::loadString_abi_cxx11_(local_100,&this->mImageData,(size_t *)&classDef);
      (anonymous_namespace)::loadString_abi_cxx11_
                ((_anonymous_namespace_ *)&field.mAttributes._M_h._M_single_bucket,&this->mImageData
                 ,(size_t *)&classDef);
      std::__cxx11::string::string(local_1b8,(string *)local_100);
      std::__cxx11::string::string(local_1d8,(string *)&field.mAttributes._M_h._M_single_bucket);
      Loader::Field::Field((Field *)local_198,(string *)local_1b8,(string *)local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1b8);
      pAVar3 = Loader::Field::attributes_abi_cxx11_((Field *)local_198);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
      ::operator=(pAVar3,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
                          *)local_e0);
      this_01 = (vector<stackjit::Loader::Field,std::allocator<stackjit::Loader::Field>> *)
                Loader::Class::fields(local_30);
      std::vector<stackjit::Loader::Field,std::allocator<stackjit::Loader::Field>>::
      emplace_back<stackjit::Loader::Field&>(this_01,(Field *)local_198);
      Loader::Field::~Field((Field *)local_198);
      std::__cxx11::string::~string((string *)&field.mAttributes._M_h._M_single_bucket);
      std::__cxx11::string::~string((string *)local_100);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
                        *)local_e0);
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::erase(&this->mClassBodyOffsets,className);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AssemblyImage::loadClassBody(std::string className) {
		if (mClassBodyOffsets.count(className) > 0) {
			auto bodyOffset = mClassBodyOffsets[className];

			Loader::Class& classDef = mClasses[className];
			classDef.parentClassName() = loadString(mImageData, bodyOffset);
			classDef.attributes() = AssemblyImageLoader::loadAttributes(mImageData, bodyOffset);

			auto numFields = loadData<std::size_t>(mImageData, bodyOffset);
			for (std::size_t i = 0; i < numFields; i++) {
				auto attributes = AssemblyImageLoader::loadAttributes(mImageData, bodyOffset);
				auto fieldName = loadString(mImageData, bodyOffset);
				auto fieldType = loadString(mImageData, bodyOffset);
				Loader::Field field(fieldName, fieldType);
				field.attributes() = attributes;
				classDef.fields().emplace_back(field);
			}

			mClassBodyOffsets.erase(className);
			return true;
		}

		return false;
	}